

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_capa_resp(connectdata *conn,int pop3code,pop3state instate)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  size_t sStack_50;
  uint mechbit;
  size_t llen;
  size_t wordlen;
  size_t len;
  char *line;
  pop3_conn *pop3c;
  SessionHandle *data;
  pop3state local_18;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  pop3c = (pop3_conn *)conn->data;
  line = (char *)&conn->proto;
  len = (size_t)(((SessionHandle *)pop3c)->state).buffer;
  local_18 = instate;
  result = pop3code;
  _instate_local = conn;
  wordlen = strlen((char *)len);
  if (result == CURLE_ABORTED_BY_CALLBACK) {
    if ((wordlen < 4) || (*(int *)len != 0x534c5453)) {
      if ((wordlen < 4) || (*(int *)len != 0x52455355)) {
        if ((4 < wordlen) && (iVar1 = memcmp((void *)len,"SASL ",5), iVar1 == 0)) {
          *(uint *)(line + 0xa8) = *(uint *)(line + 0xa8) | 4;
          len = len + 5;
          wordlen = wordlen - 5;
          while( true ) {
            while( true ) {
              bVar3 = false;
              if ((((wordlen != 0) && (bVar3 = true, *(char *)len != ' ')) &&
                  (bVar3 = true, *(char *)len != '\t')) && (bVar3 = true, *(char *)len != '\r')) {
                bVar3 = *(char *)len == '\n';
              }
              if (!bVar3) break;
              len = len + 1;
              wordlen = wordlen - 1;
            }
            if (wordlen == 0) break;
            llen = 0;
            while( true ) {
              bVar3 = false;
              if (((llen < wordlen) && (bVar3 = false, *(char *)(len + llen) != ' ')) &&
                 ((bVar3 = false, *(char *)(len + llen) != '\t' &&
                  (bVar3 = false, *(char *)(len + llen) != '\r')))) {
                bVar3 = *(char *)(len + llen) != '\n';
              }
              if (!bVar3) break;
              llen = llen + 1;
            }
            uVar2 = Curl_sasl_decode_mech((char *)len,llen,&stack0xffffffffffffffb0);
            if ((uVar2 != 0) && (sStack_50 == llen)) {
              *(uint *)(line + 0x94) = uVar2 | *(uint *)(line + 0x94);
            }
            len = llen + len;
            wordlen = wordlen - llen;
          }
        }
      }
      else {
        *(uint *)(line + 0xa8) = *(uint *)(line + 0xa8) | 1;
      }
    }
    else {
      line[0xb8] = '\x01';
    }
  }
  else if (result == CURLE_BAD_FUNCTION_ARGUMENT) {
    if ((*(int *)&pop3c[6].pp.pending_resp == 0) || ((_instate_local->ssl[0].use & 1U) != 0)) {
      data._4_4_ = pop3_perform_authentication(_instate_local);
    }
    else if ((line[0xb8] & 1U) == 0) {
      if (*(int *)&pop3c[6].pp.pending_resp == 1) {
        data._4_4_ = pop3_perform_authentication(_instate_local);
      }
      else {
        Curl_failf((SessionHandle *)pop3c,"STLS not supported.");
        data._4_4_ = CURLE_USE_SSL_FAILED;
      }
    }
    else {
      data._4_4_ = pop3_perform_starttls(_instate_local);
    }
  }
  else {
    *(uint *)(line + 0xa8) = *(uint *)(line + 0xa8) | 1;
    data._4_4_ = pop3_perform_authentication(_instate_local);
  }
  return data._4_4_;
}

Assistant:

static CURLcode pop3_state_capa_resp(struct connectdata *conn, int pop3code,
                                     pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  const char *line = data->state.buffer;
  size_t len = strlen(line);
  size_t wordlen;

  (void)instate; /* no use for this yet */

  /* Do we have a untagged response? */
  if(pop3code == '*') {
    /* Does the server support the STLS capability? */
    if(len >= 4 && !memcmp(line, "STLS", 4))
      pop3c->tls_supported = TRUE;

    /* Does the server support clear text authentication? */
    else if(len >= 4 && !memcmp(line, "USER", 4))
      pop3c->authtypes |= POP3_TYPE_CLEARTEXT;

    /* Does the server support SASL based authentication? */
    else if(len >= 5 && !memcmp(line, "SASL ", 5)) {
      pop3c->authtypes |= POP3_TYPE_SASL;

      /* Advance past the SASL keyword */
      line += 5;
      len -= 5;

      /* Loop through the data line */
      for(;;) {
        size_t llen;
        unsigned int mechbit;

        while(len &&
              (*line == ' ' || *line == '\t' ||
               *line == '\r' || *line == '\n')) {

          line++;
          len--;
        }

        if(!len)
          break;

        /* Extract the word */
        for(wordlen = 0; wordlen < len && line[wordlen] != ' ' &&
              line[wordlen] != '\t' && line[wordlen] != '\r' &&
              line[wordlen] != '\n';)
          wordlen++;

        /* Test the word for a matching authentication mechanism */
        if((mechbit = Curl_sasl_decode_mech(line, wordlen, &llen)) &&
           llen == wordlen)
          pop3c->sasl.authmechs |= mechbit;

        line += wordlen;
        len -= wordlen;
      }
    }
  }
  else if(pop3code == '+') {
    if(data->set.use_ssl && !conn->ssl[FIRSTSOCKET].use) {
      /* We don't have a SSL/TLS connection yet, but SSL is requested */
      if(pop3c->tls_supported)
        /* Switch to TLS connection now */
        result = pop3_perform_starttls(conn);
      else if(data->set.use_ssl == CURLUSESSL_TRY)
        /* Fallback and carry on with authentication */
        result = pop3_perform_authentication(conn);
      else {
        failf(data, "STLS not supported.");
        result = CURLE_USE_SSL_FAILED;
      }
    }
    else
      result = pop3_perform_authentication(conn);
  }
  else {
    /* Clear text is supported when CAPA isn't recognised */
    pop3c->authtypes |= POP3_TYPE_CLEARTEXT;

    result = pop3_perform_authentication(conn);
  }

  return result;
}